

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O0

Proxy * __thiscall Proxy::operator=(Proxy *this,Proxy *param_2)

{
  long lVar1;
  undefined1 uVar2;
  CService *in_RSI;
  Proxy *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::operator=(in_RSI,&in_RDI->proxy);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_00000038,in_stack_00000030);
  uVar2 = *(undefined1 *)((long)&in_RSI[1].port + 1);
  in_RDI->m_is_unix_socket = (bool)*(undefined1 *)&in_RSI[1].port;
  in_RDI->m_randomize_credentials = (bool)uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Proxy() : m_is_unix_socket(false), m_randomize_credentials(false) {}